

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O3

JSValue js_string_slice(JSContext *ctx,JSValue this_val,int argc,JSValue *argv)

{
  JSValue JVar1;
  int iVar2;
  JSValueUnion p_00;
  uint uVar3;
  uint uVar4;
  JSRefCountHeader *p;
  JSValue v;
  JSValue JVar5;
  int end;
  int start;
  uint local_38;
  uint local_34;
  
  v = JS_ToStringCheckObject(ctx,this_val);
  p_00 = v.u;
  uVar4 = (uint)v.tag;
  JVar5 = v;
  if (uVar4 != 6) {
    uVar3 = *(uint *)((long)p_00.ptr + 4) & 0x7fffffff;
    iVar2 = JS_ToInt32Clamp(ctx,(int *)&local_34,*argv,0,uVar3,uVar3);
    if ((iVar2 == 0) &&
       ((local_38 = uVar3, (int)argv[1].tag == 3 ||
        (JVar5.tag = argv[1].tag, JVar5.u.ptr = argv[1].u.ptr,
        iVar2 = JS_ToInt32Clamp(ctx,(int *)&local_38,JVar5,0,uVar3,uVar3), iVar2 == 0)))) {
      uVar3 = local_38;
      if ((int)local_38 <= (int)local_34) {
        uVar3 = local_34;
      }
      JVar5 = js_sub_string(ctx,(JSString *)p_00.ptr,local_34,uVar3);
      if (uVar4 < 0xfffffff5) {
        return JVar5;
      }
      iVar2 = *p_00.ptr;
      *(int *)p_00.ptr = iVar2 + -1;
      JVar1 = JVar5;
    }
    else {
      if (uVar4 < 0xfffffff5) {
        return (JSValue)(ZEXT816(6) << 0x40);
      }
      iVar2 = *p_00.ptr;
      *(int *)p_00.ptr = iVar2 + -1;
      JVar1 = (JSValue)(ZEXT816(6) << 0x40);
      JVar5 = (JSValue)(ZEXT816(6) << 0x40);
    }
    if (iVar2 < 2) {
      __JS_FreeValueRT(ctx->rt,v);
      JVar5 = JVar1;
    }
  }
  return JVar5;
}

Assistant:

static JSValue js_string_slice(JSContext *ctx, JSValueConst this_val,
                               int argc, JSValueConst *argv)
{
    JSValue str, ret;
    int len, start, end;
    JSString *p;

    str = JS_ToStringCheckObject(ctx, this_val);
    if (JS_IsException(str))
        return str;
    p = JS_VALUE_GET_STRING(str);
    len = p->len;
    if (JS_ToInt32Clamp(ctx, &start, argv[0], 0, len, len)) {
        JS_FreeValue(ctx, str);
        return JS_EXCEPTION;
    }
    end = len;
    if (!JS_IsUndefined(argv[1])) {
        if (JS_ToInt32Clamp(ctx, &end, argv[1], 0, len, len)) {
            JS_FreeValue(ctx, str);
            return JS_EXCEPTION;
        }
    }
    ret = js_sub_string(ctx, p, start, max_int(end, start));
    JS_FreeValue(ctx, str);
    return ret;
}